

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

double __thiscall
cmsys::SystemInformationImplementation::GetLoadAverage(SystemInformationImplementation *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double loadavg [3];
  double local_18 [3];
  
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  local_18[2] = 0.0;
  iVar1 = getloadavg(local_18,3);
  if (iVar1 < 1) {
    uVar2 = 0;
    uVar3 = 0x80000000;
  }
  else {
    uVar2 = SUB84(local_18[0],0);
    uVar3 = (undefined4)((ulong)local_18[0] >> 0x20);
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

double SystemInformationImplementation::GetLoadAverage()
{
#if defined(KWSYS_CXX_HAS_GETLOADAVG)
  double loadavg[3] = { 0.0, 0.0, 0.0 };
  if (getloadavg(loadavg, 3) > 0)
    {
    return loadavg[0];
    }
  return -0.0;
#elif defined(KWSYS_SYSTEMINFORMATION_USE_GetSystemTimes)
  // Old windows.h headers do not provide GetSystemTimes.
  typedef BOOL (WINAPI *GetSystemTimesType)(LPFILETIME, LPFILETIME,
                                            LPFILETIME);
  static GetSystemTimesType pGetSystemTimes =
    (GetSystemTimesType)GetProcAddress(GetModuleHandleW(L"kernel32"),
                                       "GetSystemTimes");
  FILETIME idleTime, kernelTime, userTime;
  if (pGetSystemTimes && pGetSystemTimes(&idleTime, &kernelTime, &userTime))
    {
    unsigned __int64 const idleTicks =
      fileTimeToUInt64(idleTime);
    unsigned __int64 const totalTicks =
      fileTimeToUInt64(kernelTime) + fileTimeToUInt64(userTime);
    return calculateCPULoad(idleTicks, totalTicks) * GetNumberOfPhysicalCPU();
    }
  return -0.0;
#else
  // Not implemented on this platform.
  return -0.0;
#endif
}